

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

mbedtls_md_type_t mbedtls_ssl_md_alg_from_hash(uchar hash)

{
  mbedtls_md_type_t local_c;
  uchar hash_local;
  
  switch(hash) {
  case '\x01':
    local_c = MBEDTLS_MD_MD5;
    break;
  case '\x02':
    local_c = MBEDTLS_MD_SHA1;
    break;
  case '\x03':
    local_c = MBEDTLS_MD_SHA224;
    break;
  case '\x04':
    local_c = MBEDTLS_MD_SHA256;
    break;
  case '\x05':
    local_c = MBEDTLS_MD_SHA384;
    break;
  case '\x06':
    local_c = MBEDTLS_MD_SHA512;
    break;
  default:
    local_c = MBEDTLS_MD_NONE;
  }
  return local_c;
}

Assistant:

mbedtls_md_type_t mbedtls_ssl_md_alg_from_hash( unsigned char hash )
{
    switch( hash )
    {
#if defined(MBEDTLS_MD5_C)
        case MBEDTLS_SSL_HASH_MD5:
            return( MBEDTLS_MD_MD5 );
#endif
#if defined(MBEDTLS_SHA1_C)
        case MBEDTLS_SSL_HASH_SHA1:
            return( MBEDTLS_MD_SHA1 );
#endif
#if defined(MBEDTLS_SHA256_C)
        case MBEDTLS_SSL_HASH_SHA224:
            return( MBEDTLS_MD_SHA224 );
        case MBEDTLS_SSL_HASH_SHA256:
            return( MBEDTLS_MD_SHA256 );
#endif
#if defined(MBEDTLS_SHA512_C)
        case MBEDTLS_SSL_HASH_SHA384:
            return( MBEDTLS_MD_SHA384 );
        case MBEDTLS_SSL_HASH_SHA512:
            return( MBEDTLS_MD_SHA512 );
#endif
        default:
            return( MBEDTLS_MD_NONE );
    }
}